

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fInternalFormatQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::InternalFormatQueryTests::init
          (InternalFormatQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  TestContext *testCtx;
  char *name_00;
  Context *pCVar3;
  int extraout_EAX;
  TestNode *pTVar4;
  char *description;
  long *plVar5;
  TestNode *pTVar6;
  long lVar7;
  long *plVar8;
  string desc;
  string name;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  deUint32 local_84;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  long local_40;
  TestNode *local_38;
  
  lVar7 = 0;
  do {
    pTVar4 = (TestNode *)operator_new(0x70);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    name_00 = init::textureTargets[lVar7].name;
    local_84 = init::textureTargets[lVar7].target;
    local_40 = lVar7;
    description = glu::getInternalFormatTargetName(local_84);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar4,testCtx,name_00,description);
    local_38 = pTVar4;
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    lVar7 = 0xc;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,*(char **)((long)&PTR_iterate_021a4840 + lVar7 + 4),
                 (allocator<char> *)local_60);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_70 = *plVar8;
        lStack_68 = plVar5[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar8;
        local_80 = (long *)*plVar5;
      }
      local_78 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Verify GL_SAMPLES of ","")
      ;
      plVar5 = (long *)std::__cxx11::string::append((char *)local_60);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_98 = *plVar8;
        lStack_90 = plVar5[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar8;
        local_a8 = (long *)*plVar5;
      }
      local_a0 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      pTVar4 = (TestNode *)operator_new(0x88);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      uVar1 = *(undefined4 *)(&UNK_021a484c + lVar7);
      uVar2 = *(undefined4 *)((long)&init::internalFormats[0].name + lVar7);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar4,pCVar3->m_testCtx,(char *)local_80,(char *)local_a8);
      pTVar4[1]._vptr_TestNode = (_func_int **)pCVar3;
      pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a4b38;
      *(deUint32 *)&pTVar4[1].m_testCtx = local_84;
      *(undefined4 *)((long)&pTVar4[1].m_testCtx + 4) = uVar1;
      *(undefined4 *)&pTVar4[1].m_name._M_dataplus._M_p = uVar2;
      tcu::TestNode::addChild(local_38,pTVar4);
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,local_70 + 1);
      }
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x29c);
    lVar7 = local_40 + 1;
  } while (lVar7 != 3);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "partial_query","Query data to too short a buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"num_sample_counts",
             "Query GL_NUM_SAMPLE_COUNTS to too short a buffer");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a4b88;
  tcu::TestNode::addChild(pTVar4,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"samples","Query GL_SAMPLES to too short a buffer"
            );
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a4bd8;
  tcu::TestNode::addChild(pTVar4,pTVar6);
  return extraout_EAX;
}

Assistant:

void InternalFormatQueryTests::init (void)
{
	static const struct InternalFormat
	{
		const char*						name;
		glw::GLenum						format;
		FormatSamplesCase::FormatType	type;
	} internalFormats[] =
	{
		// color renderable
		{ "r8",						GL_R8,					FormatSamplesCase::FORMAT_COLOR			},
		{ "rg8",					GL_RG8,					FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb8",					GL_RGB8,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb565",					GL_RGB565,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgba4",					GL_RGBA4,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb5_a1",				GL_RGB5_A1,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgba8",					GL_RGBA8,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb10_a2",				GL_RGB10_A2,			FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb10_a2ui",				GL_RGB10_A2UI,			FormatSamplesCase::FORMAT_INT			},
		{ "srgb8_alpha8",			GL_SRGB8_ALPHA8,		FormatSamplesCase::FORMAT_COLOR			},
		{ "r8i",					GL_R8I,					FormatSamplesCase::FORMAT_INT			},
		{ "r8ui",					GL_R8UI,				FormatSamplesCase::FORMAT_INT			},
		{ "r16i",					GL_R16I,				FormatSamplesCase::FORMAT_INT			},
		{ "r16ui",					GL_R16UI,				FormatSamplesCase::FORMAT_INT			},
		{ "r32i",					GL_R32I,				FormatSamplesCase::FORMAT_INT			},
		{ "r32ui",					GL_R32UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rg8i",					GL_RG8I,				FormatSamplesCase::FORMAT_INT			},
		{ "rg8ui",					GL_RG8UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rg16i",					GL_RG16I,				FormatSamplesCase::FORMAT_INT			},
		{ "rg16ui",					GL_RG16UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rg32i",					GL_RG32I,				FormatSamplesCase::FORMAT_INT			},
		{ "rg32ui",					GL_RG32UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba8i",					GL_RGBA8I,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba8ui",				GL_RGBA8UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba16i",				GL_RGBA16I,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba16ui",				GL_RGBA16UI,			FormatSamplesCase::FORMAT_INT			},
		{ "rgba32i",				GL_RGBA32I,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba32ui",				GL_RGBA32UI,			FormatSamplesCase::FORMAT_INT			},

		// float formats
		{ "r16f",					GL_R16F,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rg16f",					GL_RG16F,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgba16f",				GL_RGBA16F,				FormatSamplesCase::FORMAT_COLOR			},
		{ "r32f",					GL_R32F,				FormatSamplesCase::FORMAT_INT			},
		{ "rg32f",					GL_RG32F,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba32f",				GL_RGBA32F,				FormatSamplesCase::FORMAT_INT			},
		{ "r11f_g11f_b10f",			GL_R11F_G11F_B10F,		FormatSamplesCase::FORMAT_COLOR			},

		// depth renderable
		{ "depth_component16",		GL_DEPTH_COMPONENT16,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},
		{ "depth_component24",		GL_DEPTH_COMPONENT24,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},
		{ "depth_component32f",		GL_DEPTH_COMPONENT32F,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},
		{ "depth24_stencil8",		GL_DEPTH24_STENCIL8,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},
		{ "depth32f_stencil8",		GL_DEPTH32F_STENCIL8,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},

		// stencil renderable
		{ "stencil_index8",			GL_STENCIL_INDEX8,		FormatSamplesCase::FORMAT_DEPTH_STENCIL	}
		// DEPTH24_STENCIL8,  duplicate
		// DEPTH32F_STENCIL8  duplicate
	};

	static const struct
	{
		const char*	name;
		deUint32	target;
	} textureTargets[] =
	{
		{ "renderbuffer",					GL_RENDERBUFFER					},
		{ "texture_2d_multisample",			GL_TEXTURE_2D_MULTISAMPLE		},
		{ "texture_2d_multisample_array",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY	},
	};

	for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(textureTargets); ++groupNdx)
	{
		tcu::TestCaseGroup* const	group		= new tcu::TestCaseGroup(m_testCtx, textureTargets[groupNdx].name, glu::getInternalFormatTargetName(textureTargets[groupNdx].target));
		const glw::GLenum			texTarget	= textureTargets[groupNdx].target;

		addChild(group);

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(internalFormats); ++caseNdx)
		{
			const std::string name = std::string(internalFormats[caseNdx].name) + "_samples";
			const std::string desc = std::string("Verify GL_SAMPLES of ") + internalFormats[caseNdx].name;

			group->addChild(new FormatSamplesCase(m_context, name.c_str(), desc.c_str(), texTarget, internalFormats[caseNdx].format, internalFormats[caseNdx].type));
		}
	}

	// Check buffer sizes are honored
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "partial_query", "Query data to too short a buffer");

		addChild(group);

		group->addChild(new NumSampleCountsBufferCase	(m_context, "num_sample_counts",	"Query GL_NUM_SAMPLE_COUNTS to too short a buffer"));
		group->addChild(new SamplesBufferCase			(m_context, "samples",				"Query GL_SAMPLES to too short a buffer"));
	}
}